

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BroadcastReceiver.h
# Opt level: O2

bool __thiscall
aeron::concurrent::broadcast::BroadcastReceiver::receiveNext(BroadcastReceiver *this)

{
  int64_t cursor;
  bool bVar1;
  int32_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  uint offset;
  
  iVar3 = AtomicBuffer::getInt64Volatile(this->m_buffer,this->m_tailCounterIndex);
  cursor = this->m_nextRecord;
  if (cursor < iVar3) {
    offset = this->m_mask & (uint)cursor;
    bVar1 = validate(this,cursor);
    iVar4 = cursor;
    if (!bVar1) {
      LOCK();
      (this->m_lappedCount).super___atomic_base<long>._M_i =
           (this->m_lappedCount).super___atomic_base<long>._M_i + 1;
      UNLOCK();
      iVar4 = AtomicBuffer::getInt64(this->m_buffer,this->m_latestCounterIndex);
      offset = (uint)iVar4 & this->m_mask;
    }
    this->m_cursor = iVar4;
    iVar2 = AtomicBuffer::getInt32(this->m_buffer,offset);
    this->m_nextRecord = (int)(iVar2 + 7U & 0xfffffff8) + iVar4;
    iVar2 = AtomicBuffer::getInt32(this->m_buffer,offset + 4);
    if (iVar2 == -1) {
      this->m_cursor = this->m_nextRecord;
      offset = 0;
      iVar2 = AtomicBuffer::getInt32(this->m_buffer,0);
      this->m_nextRecord = this->m_nextRecord + (long)(int)(iVar2 + 7U & 0xfffffff8);
    }
    this->m_recordOffset = offset;
  }
  return cursor < iVar3;
}

Assistant:

bool receiveNext()
    {
        bool isAvailable = false;
        const std::int64_t tail = m_buffer.getInt64Volatile(m_tailCounterIndex);
        std::int64_t cursor = m_nextRecord;

        if (tail > cursor)
        {
            util::index_t recordOffset = (std::int32_t)cursor & m_mask;

            if (!validate(cursor))
            {
                m_lappedCount += 1;
                cursor = m_buffer.getInt64(m_latestCounterIndex);
                recordOffset = (std::int32_t)cursor & m_mask;
            }

            m_cursor = cursor;
            m_nextRecord = cursor + util::BitUtil::align(
                m_buffer.getInt32(RecordDescriptor::lengthOffset(recordOffset)), RecordDescriptor::RECORD_ALIGNMENT);

            if (RecordDescriptor::PADDING_MSG_TYPE_ID == m_buffer.getInt32(RecordDescriptor::typeOffset(recordOffset)))
            {
                recordOffset = 0;
                m_cursor = m_nextRecord;
                m_nextRecord += util::BitUtil::align(m_buffer.getInt32(
                    RecordDescriptor::lengthOffset(recordOffset)), RecordDescriptor::RECORD_ALIGNMENT);
            }

            m_recordOffset = recordOffset;
            isAvailable = true;
        }

        return isAvailable;
    }